

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

int http_client_execute(http_client *client,http_message *response)

{
  long lVar1;
  size_t len;
  bool local_39;
  char *local_38;
  char *pos;
  ssize_t remains;
  ssize_t count;
  ssize_t nbytes;
  http_message *response_local;
  http_client *client_local;
  
  http_message_init(response);
  client->response = response;
  _prepare_resquest(client);
  tcp_client_connect(&client->connector,client->host,client->port);
  local_38 = (client->request_buffer).p;
  pos = (char *)client->request_buffer_used;
  do {
    lVar1 = tcp_client_send(&client->connector,local_38,(size_t)pos);
    pos = pos + -lVar1;
    local_38 = local_38 + lVar1;
    local_39 = 0 < lVar1 && 0 < (long)pos;
  } while (local_39);
  http_parser_init(&client->parser,HTTP_RESPONSE);
  (client->parser).data = client;
  remains = 0;
  local_38 = (client->response_buffer).p;
  do {
    len = tcp_client_recv(&client->connector,local_38,(client->response_buffer).len - remains);
    if ((long)len < 1) break;
    http_parser_execute(&client->parser,&client->settings,local_38,len);
    remains = len + remains;
    local_38 = local_38 + len;
  } while (((client->response_complete ^ 0xffU) & 1) != 0);
  tcp_client_close(&client->connector);
  return 0;
}

Assistant:

int http_client_execute(http_client* client, http_message* response)
{
    ssize_t nbytes = 0, count = 0, remains = 0;
    char* pos;

    http_message_init(response);
    client->response = response;
    _prepare_resquest(client);
    tcp_client_connect(&client->connector, client->host, client->port);

    count = 0;
    pos = (char*)client->request_buffer.p;
    remains = client->request_buffer_used;
    do {
        nbytes = tcp_client_send(&client->connector, pos, remains);
        remains -= nbytes;
        count += nbytes;
        pos += nbytes;
    } while (nbytes > 0 && remains > 0);

    LOGD("sent count: %ld\n", count);

    // parser reset
    http_parser_init(&client->parser, HTTP_RESPONSE);
    client->parser.data = client;

    count = 0;
    pos = (char*)client->response_buffer.p;
    do {
        nbytes = tcp_client_recv(&client->connector, pos,
                                 client->response_buffer.len - count);
        if (nbytes <= 0) break;
        http_parser_execute(&client->parser, &client->settings, pos, nbytes);
        count += nbytes;
        pos += nbytes;
    } while (!client->response_complete);
    LOGD("recv count: %ld\n", count);

    tcp_client_close(&client->connector);
    return 0;
}